

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifsav(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  int iVar2;
  char *ext;
  runsdef val;
  char buf [4096];
  runsdef rStack_1028;
  char local_1018 [4104];
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp == '\x03') {
    bifcstr(ctx,local_1018,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
    ext = "sav";
    if (ctx->bifcxsavext != (char *)0x0) {
      ext = ctx->bifcxsavext;
    }
    os_defext(local_1018,ext);
    iVar2 = fiosav(ctx->bifcxrun->runcxvoc,local_1018,ctx->bifcxrun->runcxgamename);
    runpush(ctx->bifcxrun,(uint)(iVar2 != 0) * 3 + 5,&rStack_1028);
    return;
  }
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void bifsav(bifcxdef *ctx, int argc)
{
    uchar   *fn;
    char     buf[OSFNMAX];
    int      err;
    runsdef  val;
    
    bifcntargs(ctx, 1, argc);
    fn = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, buf, (size_t)sizeof(buf), fn);
    os_defext(buf, ctx->bifcxsavext != 0 ? ctx->bifcxsavext : "sav");
    err = fiosav(ctx->bifcxrun->runcxvoc, buf, ctx->bifcxrun->runcxgamename);
    runpush(ctx->bifcxrun, runclog(err), &val);
}